

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeDelete(BtCursor *pCur,u8 flags)

{
  ushort uVar1;
  ushort uVar2;
  Btree *pBtree;
  MemPage *pPage;
  MemPage *pPage_00;
  char cVar3;
  u16 uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  u8 *puVar8;
  long lVar9;
  undefined7 in_register_00000031;
  u8 *puVar10;
  MemPage **ppMVar11;
  uint uVar12;
  bool bVar13;
  int rc;
  CellInfo info;
  int local_74;
  BtShared *local_70;
  undefined4 local_68;
  int local_64;
  uint local_60;
  Pgno local_5c;
  ulong local_58;
  long local_50;
  CellInfo local_48;
  
  uVar12 = (uint)CONCAT71(in_register_00000031,flags);
  pBtree = pCur->pBtree;
  local_70 = pBtree->pBt;
  local_60 = uVar12;
  if ((pCur->eState == '\x03') && (local_74 = btreeRestoreCursorPosition(pCur), local_74 != 0)) {
    return local_74;
  }
  local_64 = (int)pCur->iPage;
  uVar1 = pCur->ix;
  pPage = pCur->pPage;
  uVar7 = (ulong)pPage->maskPage;
  puVar8 = pPage->aData +
           (CONCAT11(pPage->aCellIdx[(ulong)uVar1 * 2],pPage->aCellIdx[(ulong)uVar1 * 2 + 1]) &
           pPage->maskPage);
  if (pPage->nFree < 0) {
    uVar6 = btreeComputeFreeSpace(pPage);
    uVar7 = (ulong)uVar6;
    if (uVar6 != 0) {
      return 0xb;
    }
  }
  local_68 = (undefined4)CONCAT71((int7)(uVar7 >> 8),1);
  if ((local_60 & 2) != 0) {
    if (pPage->leaf != '\0') {
      iVar5 = pPage->nFree;
      puVar10 = puVar8;
      uVar4 = cellSizePtr(pPage,puVar8);
      uVar12 = (uint)puVar10;
      if (((int)((uint)uVar4 + iVar5 + 2) <= (int)((local_70->usableSize * 2) / 3)) &&
         (pPage->nCell != 1)) {
        local_68 = 0;
        goto LAB_00174ca6;
      }
    }
    iVar5 = saveCursorKey(pCur);
    if (iVar5 != 0) {
      return iVar5;
    }
    local_74 = 0;
  }
LAB_00174ca6:
  if (((pPage->leaf != '\0') || (local_74 = sqlite3BtreePrevious(pCur,uVar12), local_74 == 0)) &&
     (((pCur->curFlags & 0x20) == 0 ||
      (local_74 = saveAllCursors(local_70,pCur->pgnoRoot,pCur), local_74 == 0)))) {
    if (pCur->pKeyInfo == (KeyInfo *)0x0) {
      invalidateIncrblobCursors(pBtree,pCur->pgnoRoot,(pCur->info).nKey,0);
    }
    local_74 = sqlite3PagerWrite(pPage->pDbPage);
    if (local_74 == 0) {
      local_74 = clearCell(pPage,puVar8,&local_48);
      dropCell(pPage,(uint)uVar1,(uint)local_48.nSize,&local_74);
      if (local_74 == 0) {
        lVar9 = (long)local_64;
        if (pPage->leaf == '\0') {
          pPage_00 = pCur->pPage;
          local_50 = lVar9;
          if ((pPage_00->nFree < 0) &&
             (iVar5 = btreeComputeFreeSpace(pPage_00), local_74 = iVar5, iVar5 != 0)) {
            bVar13 = false;
          }
          else {
            ppMVar11 = &pCur->pPage;
            if ((int)local_50 < pCur->iPage + -1) {
              ppMVar11 = pCur->apPage + local_50 + 1;
            }
            uVar12 = (uint)(CONCAT11(pPage_00->aCellIdx[(ulong)pPage_00->nCell * 2 + -2],
                                     pPage_00->aCellIdx[(ulong)pPage_00->nCell * 2 + -1]) &
                           pPage_00->maskPage);
            if (uVar12 < 4) {
              bVar13 = false;
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x119f6,
                          "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
              iVar5 = 0xb;
            }
            else {
              local_5c = (*ppMVar11)->pgno;
              puVar8 = pPage_00->aData;
              uVar4 = (*pPage_00->xCellSize)(pPage_00,puVar8 + uVar12);
              local_58 = (ulong)uVar4;
              local_70 = (BtShared *)local_70->pTmpSpace;
              local_74 = sqlite3PagerWrite(pPage_00->pDbPage);
              if (local_74 == 0) {
                insertCell(pPage,(uint)uVar1,puVar8 + uVar12 + -4,(int)local_58 + 4,(u8 *)local_70,
                           local_5c,&local_74);
              }
              dropCell(pPage_00,pPage_00->nCell - 1,(int)local_58,&local_74);
              bVar13 = local_74 == 0;
              iVar5 = local_74;
            }
          }
          lVar9 = local_50;
          if (!bVar13) {
            return iVar5;
          }
        }
        local_74 = balance(pCur);
        if ((local_74 == 0) && ((char)lVar9 < pCur->iPage)) {
          sqlite3PagerUnrefNotNull(pCur->pPage->pDbPage);
          cVar3 = pCur->iPage + -1;
          pCur->iPage = cVar3;
          if ((char)local_64 < cVar3) {
            do {
              pCur->iPage = cVar3 + -1;
              if (pCur->apPage[cVar3] != (MemPage *)0x0) {
                sqlite3PagerUnrefNotNull(pCur->apPage[cVar3]->pDbPage);
              }
              cVar3 = pCur->iPage;
            } while ((char)lVar9 < cVar3);
          }
          pCur->pPage = pCur->apPage[cVar3];
          local_74 = balance(pCur);
        }
        if (local_74 == 0) {
          if ((char)local_68 == '\0') {
            pCur->eState = '\x02';
            uVar2 = pPage->nCell;
            if (uVar1 < uVar2) {
              pCur->skipNext = 1;
            }
            else {
              pCur->skipNext = -1;
              pCur->ix = uVar2 - 1;
            }
          }
          else {
            iVar5 = moveToRoot(pCur);
            local_74 = iVar5;
            if ((local_60 & 2) != 0) {
              btreeReleaseAllCursorPages(pCur);
              pCur->eState = '\x03';
            }
            if (iVar5 == 0x10) {
              local_74 = 0;
            }
          }
        }
      }
    }
  }
  return local_74;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeDelete(BtCursor *pCur, u8 flags){
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;              
  int rc;                              /* Return code */
  MemPage *pPage;                      /* Page to delete cell from */
  unsigned char *pCell;                /* Pointer to cell to delete */
  int iCellIdx;                        /* Index of cell to delete */
  int iCellDepth;                      /* Depth of node containing pCell */ 
  CellInfo info;                       /* Size of the cell being deleted */
  int bSkipnext = 0;                   /* Leaf cursor in SKIPNEXT state */
  u8 bPreserve = flags & BTREE_SAVEPOSITION;  /* Keep cursor valid */

  assert( cursorOwnsBtShared(pCur) );
  assert( pBt->inTransaction==TRANS_WRITE );
  assert( (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( pCur->curFlags & BTCF_WriteFlag );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );
  assert( !hasReadConflicts(p, pCur->pgnoRoot) );
  assert( (flags & ~(BTREE_SAVEPOSITION | BTREE_AUXDELETE))==0 );
  if( pCur->eState==CURSOR_REQUIRESEEK ){
    rc = btreeRestoreCursorPosition(pCur);
    if( rc ) return rc;
  }
  assert( pCur->eState==CURSOR_VALID );

  iCellDepth = pCur->iPage;
  iCellIdx = pCur->ix;
  pPage = pCur->pPage;
  pCell = findCell(pPage, iCellIdx);
  if( pPage->nFree<0 && btreeComputeFreeSpace(pPage) ) return SQLITE_CORRUPT;

  /* If the bPreserve flag is set to true, then the cursor position must
  ** be preserved following this delete operation. If the current delete
  ** will cause a b-tree rebalance, then this is done by saving the cursor
  ** key and leaving the cursor in CURSOR_REQUIRESEEK state before 
  ** returning. 
  **
  ** Or, if the current delete will not cause a rebalance, then the cursor
  ** will be left in CURSOR_SKIPNEXT state pointing to the entry immediately
  ** before or after the deleted entry. In this case set bSkipnext to true.  */
  if( bPreserve ){
    if( !pPage->leaf 
     || (pPage->nFree+cellSizePtr(pPage,pCell)+2)>(int)(pBt->usableSize*2/3)
     || pPage->nCell==1  /* See dbfuzz001.test for a test case */
    ){
      /* A b-tree rebalance will be required after deleting this entry.
      ** Save the cursor key.  */
      rc = saveCursorKey(pCur);
      if( rc ) return rc;
    }else{
      bSkipnext = 1;
    }
  }

  /* If the page containing the entry to delete is not a leaf page, move
  ** the cursor to the largest entry in the tree that is smaller than
  ** the entry being deleted. This cell will replace the cell being deleted
  ** from the internal node. The 'previous' entry is used for this instead
  ** of the 'next' entry, as the previous entry is always a part of the
  ** sub-tree headed by the child page of the cell being deleted. This makes
  ** balancing the tree following the delete operation easier.  */
  if( !pPage->leaf ){
    rc = sqlite3BtreePrevious(pCur, 0);
    assert( rc!=SQLITE_DONE );
    if( rc ) return rc;
  }

  /* Save the positions of any other cursors open on this table before
  ** making any modifications.  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
  }

  /* If this is a delete operation to remove a row from a table b-tree,
  ** invalidate any incrblob cursors open on the row being deleted.  */
  if( pCur->pKeyInfo==0 ){
    invalidateIncrblobCursors(p, pCur->pgnoRoot, pCur->info.nKey, 0);
  }

  /* Make the page containing the entry to be deleted writable. Then free any
  ** overflow pages associated with the entry and finally remove the cell
  ** itself from within the page.  */
  rc = sqlite3PagerWrite(pPage->pDbPage);
  if( rc ) return rc;
  rc = clearCell(pPage, pCell, &info);
  dropCell(pPage, iCellIdx, info.nSize, &rc);
  if( rc ) return rc;

  /* If the cell deleted was not located on a leaf page, then the cursor
  ** is currently pointing to the largest entry in the sub-tree headed
  ** by the child-page of the cell that was just deleted from an internal
  ** node. The cell from the leaf node needs to be moved to the internal
  ** node to replace the deleted cell.  */
  if( !pPage->leaf ){
    MemPage *pLeaf = pCur->pPage;
    int nCell;
    Pgno n;
    unsigned char *pTmp;

    if( pLeaf->nFree<0 ){
      rc = btreeComputeFreeSpace(pLeaf);
      if( rc ) return rc;
    }
    if( iCellDepth<pCur->iPage-1 ){
      n = pCur->apPage[iCellDepth+1]->pgno;
    }else{
      n = pCur->pPage->pgno;
    }
    pCell = findCell(pLeaf, pLeaf->nCell-1);
    if( pCell<&pLeaf->aData[4] ) return SQLITE_CORRUPT_BKPT;
    nCell = pLeaf->xCellSize(pLeaf, pCell);
    assert( MX_CELL_SIZE(pBt) >= nCell );
    pTmp = pBt->pTmpSpace;
    assert( pTmp!=0 );
    rc = sqlite3PagerWrite(pLeaf->pDbPage);
    if( rc==SQLITE_OK ){
      insertCell(pPage, iCellIdx, pCell-4, nCell+4, pTmp, n, &rc);
    }
    dropCell(pLeaf, pLeaf->nCell-1, nCell, &rc);
    if( rc ) return rc;
  }

  /* Balance the tree. If the entry deleted was located on a leaf page,
  ** then the cursor still points to that page. In this case the first
  ** call to balance() repairs the tree, and the if(...) condition is
  ** never true.
  **
  ** Otherwise, if the entry deleted was on an internal node page, then
  ** pCur is pointing to the leaf page from which a cell was removed to
  ** replace the cell deleted from the internal node. This is slightly
  ** tricky as the leaf node may be underfull, and the internal node may
  ** be either under or overfull. In this case run the balancing algorithm
  ** on the leaf node first. If the balance proceeds far enough up the
  ** tree that we can be sure that any problem in the internal node has
  ** been corrected, so be it. Otherwise, after balancing the leaf node,
  ** walk the cursor up the tree to the internal node and balance it as 
  ** well.  */
  rc = balance(pCur);
  if( rc==SQLITE_OK && pCur->iPage>iCellDepth ){
    releasePageNotNull(pCur->pPage);
    pCur->iPage--;
    while( pCur->iPage>iCellDepth ){
      releasePage(pCur->apPage[pCur->iPage--]);
    }
    pCur->pPage = pCur->apPage[pCur->iPage];
    rc = balance(pCur);
  }

  if( rc==SQLITE_OK ){
    if( bSkipnext ){
      assert( bPreserve && (pCur->iPage==iCellDepth || CORRUPT_DB) );
      assert( pPage==pCur->pPage || CORRUPT_DB );
      assert( (pPage->nCell>0 || CORRUPT_DB) && iCellIdx<=pPage->nCell );
      pCur->eState = CURSOR_SKIPNEXT;
      if( iCellIdx>=pPage->nCell ){
        pCur->skipNext = -1;
        pCur->ix = pPage->nCell-1;
      }else{
        pCur->skipNext = 1;
      }
    }else{
      rc = moveToRoot(pCur);
      if( bPreserve ){
        btreeReleaseAllCursorPages(pCur);
        pCur->eState = CURSOR_REQUIRESEEK;
      }
      if( rc==SQLITE_EMPTY ) rc = SQLITE_OK;
    }
  }
  return rc;
}